

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O2

void init_arrays(void)

{
  undefined8 uVar1;
  file_parser *fp;
  errr eVar2;
  char *pcVar3;
  long lVar4;
  
  for (lVar4 = 8; lVar4 != 0x298; lVar4 = lVar4 + 0x10) {
    uVar1 = *(undefined8 *)((long)&cave_builders[0x11].builder + lVar4);
    fp = *(file_parser **)((long)&pl[0].name + lVar4);
    pcVar3 = format("Initializing %s...");
    pcVar3 = string_make(pcVar3);
    event_signal_message(EVENT_INITSTATUS,L'\0',pcVar3);
    string_free(pcVar3);
    eVar2 = run_parser(fp);
    if (eVar2 != 0) {
      quit_fmt("Cannot initialize %s.",uVar1);
    }
  }
  return;
}

Assistant:

void init_arrays(void)
{
	unsigned int i;

	for (i = 0; i < N_ELEMENTS(pl); i++) {
		char *msg = string_make(format("Initializing %s...", pl[i].name));
		event_signal_message(EVENT_INITSTATUS, 0, msg);
		string_free(msg);
		if (run_parser(pl[i].parser))
			quit_fmt("Cannot initialize %s.", pl[i].name);
	}
}